

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

void __thiscall ClipperLib::ClipperBase::InsertLocalMinima(ClipperBase *this,LocalMinima *newLm)

{
  LocalMinima *pLVar1;
  LocalMinima *pLVar2;
  LocalMinima **ppLVar3;
  
  pLVar2 = this->m_MinimaList;
  ppLVar3 = &this->m_MinimaList;
  if (pLVar2 != (LocalMinima *)0x0) {
    if (newLm->Y < pLVar2->Y) {
      do {
        pLVar1 = pLVar2;
        pLVar2 = pLVar1->next;
        if (pLVar2 == (LocalMinima *)0x0) break;
      } while (newLm->Y < pLVar2->Y);
      ppLVar3 = &pLVar1->next;
    }
    newLm->next = pLVar2;
  }
  *ppLVar3 = newLm;
  return;
}

Assistant:

void ClipperBase::InsertLocalMinima(LocalMinima *newLm)
{
  if( ! m_MinimaList )
  {
    m_MinimaList = newLm;
  }
  else if( newLm->Y >= m_MinimaList->Y )
  {
    newLm->next = m_MinimaList;
    m_MinimaList = newLm;
  } else
  {
    LocalMinima* tmpLm = m_MinimaList;
    while( tmpLm->next  && ( newLm->Y < tmpLm->next->Y ) )
      tmpLm = tmpLm->next;
    newLm->next = tmpLm->next;
    tmpLm->next = newLm;
  }
}